

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-caster.h
# Opt level: O1

Matrix<double,__1,__1,_0,__1,__1> *
dynamicgraph::signal_io_base<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cast
          (Matrix<double,__1,__1,_0,__1,__1> *__return_storage_ptr__,istringstream *is)

{
  ExceptionSignal *this;
  ErrorCodeEnum local_64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  Eigen::operator>>(is,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       __return_storage_ptr__);
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) == 0) {
    return __return_storage_ptr__;
  }
  this = (ExceptionSignal *)__cxa_allocate_exception(0x30);
  local_64 = GENERIC;
  std::__cxx11::stringbuf::str();
  std::operator+(&local_40,"failed to serialize ",&local_60);
  dynamicgraph::ExceptionSignal::ExceptionSignal(this,&local_64,(string *)&local_40);
  __cxa_throw(this,&ExceptionSignal::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

inline static T cast(std::istringstream &is) {
    T inst;
    is >> inst;
    if (is.fail()) {
      throw ExceptionSignal(ExceptionSignal::GENERIC,
                            "failed to serialize " + is.str());
    }
    return inst;
  }